

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O1

void __thiscall CVmObjTemporaryFile::load_image_data(CVmObjTemporaryFile *this,char *ptr,size_t siz)

{
  vm_tmpfil_ext *pvVar1;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  pvVar1 = vm_tmpfil_ext::alloc_ext(this,"");
  (this->super_CVmObject).ext_ = pvVar1->filename;
  return;
}

Assistant:

void CVmObjTemporaryFile::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);
    
    /* 
     *   Allocate the extension.  A temp file object loaded from the image is
     *   invalid; these objects are inherently transient.  So simply use an
     *   empty filename to indicate that the temp file is not openable. 
     */
    vm_tmpfil_ext *ext = vm_tmpfil_ext::alloc_ext(vmg_ this, "");
    ext_ = (char *)ext;
}